

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

int __thiscall
libcellml::Model::clone(Model *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  element_type *peVar3;
  ModelImpl *pMVar4;
  _func_int **pp_Var5;
  element_type *__fn_00;
  element_type *__fn_01;
  size_t sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  void *__child_stack_00;
  void *__child_stack_01;
  undefined1 local_158 [8];
  ComponentPtr c;
  size_t index_3;
  IndexStack indexStack;
  EquivalenceMap map;
  ulong local_e8;
  size_t index_2;
  undefined1 local_d0 [24];
  size_t index_1;
  undefined1 local_a8 [24];
  size_t index;
  string local_70;
  string local_40;
  byte local_19;
  __fn *local_18;
  Model *this_local;
  ModelPtr *m;
  
  local_19 = 0;
  local_18 = __fn;
  this_local = this;
  create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Entity::id_abi_cxx11_(&local_40,(Entity *)__fn);
  Entity::setId((Entity *)peVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  NamedEntity::name_abi_cxx11_(&local_70,(NamedEntity *)__fn);
  NamedEntity::setName((NamedEntity *)peVar3,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ComponentEntity::encapsulationId_abi_cxx11_((string *)&index,(ComponentEntity *)__fn);
  ComponentEntity::setEncapsulationId(&peVar3->super_ComponentEntity,(string *)&index);
  std::__cxx11::string::~string((string *)&index);
  local_a8._16_8_ = (_func_int **)0x0;
  while( true ) {
    uVar2 = local_a8._16_8_;
    pMVar4 = pFunc((Model *)__fn);
    pp_Var5 = (_func_int **)
              std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::size(&pMVar4->mUnits);
    if (pp_Var5 <= (ulong)uVar2) break;
    peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar8 = (int)pp_Var5;
    units((Model *)&index_1,(size_t)__fn);
    __fn_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&index_1);
    Units::clone((Units *)local_a8,(__fn *)__fn_00,__child_stack_00,iVar8,__arg);
    addUnits(peVar3,(UnitsPtr *)local_a8);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_a8);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&index_1);
    local_a8._16_8_ = local_a8._16_8_ + 1;
  }
  local_d0._16_8_ = (_func_int **)0x0;
  while( true ) {
    uVar2 = local_d0._16_8_;
    pp_Var5 = (_func_int **)ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (pp_Var5 <= (ulong)uVar2) break;
    peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar8 = (int)pp_Var5;
    ComponentEntity::component((ComponentEntity *)&index_2,(size_t)__fn);
    __fn_01 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&index_2);
    Component::clone((Component *)local_d0,(__fn *)__fn_01,__child_stack_01,iVar8,__arg);
    ComponentEntity::addComponent(&peVar3->super_ComponentEntity,(ComponentPtr *)local_d0);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_d0)
    ;
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)&index_2)
    ;
    local_d0._16_8_ = local_d0._16_8_ + 1;
  }
  local_e8 = 0;
  while( true ) {
    peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar6 = ComponentEntity::componentCount(&peVar3->super_ComponentEntity);
    if (sVar6 <= local_e8) break;
    peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    ComponentEntity::component
              ((ComponentEntity *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (size_t)peVar3);
    fixComponentUnits((ModelPtr *)this,
                      (ComponentPtr *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)
               &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_e8 = local_e8 + 1;
  }
  std::
  map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::map((map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
         *)&indexStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&index_3);
  c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (p_Var7 <= _Var1._M_pi) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&index_3,
               (value_type_conflict1 *)
               &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ComponentEntity::component((ComponentEntity *)local_158,(size_t)__fn);
    recordVariableEquivalences
              ((ComponentPtr *)local_158,
               (EquivalenceMap *)
               &indexStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(IndexStack *)&index_3);
    generateEquivalenceMap
              ((ComponentPtr *)local_158,
               (EquivalenceMap *)
               &indexStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(IndexStack *)&index_3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&index_3);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)local_158);
    c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_vptr__Sp_counted_base + 1);
  }
  applyEquivalenceMapToModel
            ((EquivalenceMap *)
             &indexStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ModelPtr *)this);
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&index_3);
  std::
  map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~map((map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
          *)&indexStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  if ((local_19 & 1) == 0) {
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)this);
  }
  return (int)this;
}

Assistant:

ModelPtr Model::clone() const
{
    auto m = create();

    m->setId(id());
    m->setName(name());

    m->setEncapsulationId(encapsulationId());

    for (size_t index = 0; index < pFunc()->mUnits.size(); ++index) {
        m->addUnits(units(index)->clone());
    }

    for (size_t index = 0; index < componentCount(); ++index) {
        m->addComponent(component(index)->clone());
    }

    for (size_t index = 0; index < m->componentCount(); ++index) {
        fixComponentUnits(m, m->component(index));
    }

    // Generate equivalence map starting from the models components.
    EquivalenceMap map;
    IndexStack indexStack;
    for (size_t index = 0; index < componentCount(); ++index) {
        indexStack.push_back(index);
        auto c = component(index);
        recordVariableEquivalences(c, map, indexStack);
        generateEquivalenceMap(c, map, indexStack);
        indexStack.pop_back();
    }
    applyEquivalenceMapToModel(map, m);

    return m;
}